

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

void R_MapTiltedPlane(int y,int x1)

{
  BYTE *pBVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  BYTE *pBVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  BYTE **ppBVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  BYTE *pBVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  
  fVar19 = (float)(centery - y);
  fVar22 = (float)(x1 - centerx);
  iVar8 = spanend[y] - x1;
  dVar27 = (double)(plane_sz.X * fVar22 + plane_sz.Y * fVar19 + plane_sz.Z);
  if (plane_shade) {
    R_CalcTiltedLighting
              ((double)planelightfloat * dVar27,
               ((double)(plane_sz.X * (float)iVar8) + dVar27) * (double)planelightfloat,iVar8);
    fVar19 = (float)(centery - y);
    fVar22 = (float)(x1 - centerx);
  }
  pBVar5 = dc_destorg;
  iVar2 = ylookup[y];
  pBVar1 = dc_destorg + (x1 + iVar2);
  bVar4 = 0x20 - (byte)ds_ybits;
  bVar6 = bVar4 - (byte)ds_xbits;
  uVar11 = ~(-1 << ((byte)ds_xbits & 0x1f)) << ((byte)ds_ybits & 0x1f);
  dVar20 = (double)(fVar22 * plane_sv.X + plane_sv.Z + fVar19 * plane_sv.Y);
  dVar21 = (double)(fVar22 * plane_su.X + plane_su.Z + fVar19 * plane_su.Y);
  dVar17 = (1.0 / dVar27) * dVar20;
  dVar18 = (1.0 / dVar27) * dVar21;
  iVar7 = iVar8 + 1;
  uVar14 = 0;
  if (0xe < iVar8) {
    fVar19 = plane_sz.X * 16.0;
    fVar22 = plane_sv.X * 16.0;
    fVar24 = plane_su.X * 16.0;
    ppBVar9 = tiltlighting;
    pBVar16 = pBVar1;
    dVar23 = dVar17;
    dVar25 = dVar18;
    iVar8 = iVar7;
    do {
      dVar20 = dVar20 + (double)fVar22;
      dVar21 = dVar21 + (double)fVar24;
      dVar27 = dVar27 + (double)fVar19;
      dVar17 = (1.0 / dVar27) * dVar20;
      dVar18 = (1.0 / dVar27) * dVar21;
      uVar10 = (int)(long)dVar25 + pviewx;
      uVar15 = (int)(long)dVar23 + pviewy;
      uVar13 = (int)uVar14 + 0x10;
      uVar14 = (ulong)uVar13;
      lVar12 = 0;
      do {
        pBVar16[lVar12] =
             ppBVar9[lVar12]
             [ds_source[uVar10 >> (bVar6 & 0x1f) & uVar11 | uVar15 >> (bVar4 & 0x1f)]];
        uVar10 = uVar10 + (int)(long)((dVar18 - dVar25) * 0.0625);
        uVar15 = uVar15 + (int)(long)((dVar17 - dVar23) * 0.0625);
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x10);
      iVar7 = iVar8 + -0x10;
      ppBVar9 = ppBVar9 + 0x10;
      pBVar16 = pBVar16 + 0x10;
      bVar3 = 0x1f < iVar8;
      dVar23 = dVar17;
      dVar25 = dVar18;
      iVar8 = iVar7;
    } while (bVar3);
    uVar14 = (ulong)(int)uVar13;
  }
  if (0 < iVar7) {
    if (iVar7 == 1) {
      pBVar1[uVar14] =
           tiltlighting[uVar14]
           [ds_source[(uint)(long)dVar18 >> (bVar6 & 0x1f) & uVar11 |
                      (uint)(long)dVar17 >> (bVar4 & 0x1f)]];
    }
    else {
      dVar23 = (double)iVar7;
      dVar25 = (double)plane_su.X;
      dVar26 = (double)plane_sv.X;
      dVar27 = 1.0 / ((double)plane_sz.X * dVar23 + dVar27);
      uVar10 = (int)(long)dVar18 + pviewx;
      uVar13 = (int)(long)dVar17 + pviewy;
      lVar12 = 0;
      do {
        pBVar5[lVar12 + (long)(x1 + iVar2) + uVar14] =
             tiltlighting[lVar12 + uVar14]
             [ds_source[uVar10 >> (bVar6 & 0x1f) & uVar11 | uVar13 >> (bVar4 & 0x1f)]];
        uVar10 = uVar10 + (int)(long)(((dVar21 + dVar25 * dVar23) * dVar27 - dVar18) *
                                     (1.0 / dVar23));
        uVar13 = uVar13 + (int)(long)((dVar27 * (dVar26 * dVar23 + dVar20) - dVar17) *
                                     (1.0 / dVar23));
        lVar12 = lVar12 + 1;
      } while (iVar7 != (int)lVar12);
    }
  }
  return;
}

Assistant:

void R_MapTiltedPlane (int y, int x1)
{
	int x2 = spanend[y];
	int width = x2 - x1;
	double iz, uz, vz;
	BYTE *fb;
	DWORD u, v;
	int i;

	iz = plane_sz[2] + plane_sz[1]*(centery-y) + plane_sz[0]*(x1-centerx);

	// Lighting is simple. It's just linear interpolation from start to end
	if (plane_shade)
	{
		uz = (iz + plane_sz[0]*width) * planelightfloat;
		vz = iz * planelightfloat;
		R_CalcTiltedLighting (vz, uz, width);
	}

	uz = plane_su[2] + plane_su[1]*(centery-y) + plane_su[0]*(x1-centerx);
	vz = plane_sv[2] + plane_sv[1]*(centery-y) + plane_sv[0]*(x1-centerx);

	fb = ylookup[y] + x1 + dc_destorg;

	BYTE vshift = 32 - ds_ybits;
	BYTE ushift = vshift - ds_xbits;
	int umask = ((1 << ds_xbits) - 1) << ds_ybits;

#if 0		// The "perfect" reference version of this routine. Pretty slow.
			// Use it only to see how things are supposed to look.
	i = 0;
	do
	{
		double z = 1.f/iz;

		u = SQWORD(uz*z) + pviewx;
		v = SQWORD(vz*z) + pviewy;
		ds_colormap = tiltlighting[i];
		fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
		iz += plane_sz[0];
		uz += plane_su[0];
		vz += plane_sv[0];
	} while (--width >= 0);
#else
//#define SPANSIZE 32
//#define INVSPAN 0.03125f
//#define SPANSIZE 8
//#define INVSPAN 0.125f
#define SPANSIZE 16
#define INVSPAN	0.0625f

	double startz = 1.f/iz;
	double startu = uz*startz;
	double startv = vz*startz;
	double izstep, uzstep, vzstep;

	izstep = plane_sz[0] * SPANSIZE;
	uzstep = plane_su[0] * SPANSIZE;
	vzstep = plane_sv[0] * SPANSIZE;
	x1 = 0;
	width++;

	while (width >= SPANSIZE)
	{
		iz += izstep;
		uz += uzstep;
		vz += vzstep;

		double endz = 1.f/iz;
		double endu = uz*endz;
		double endv = vz*endz;
		DWORD stepu = SQWORD((endu - startu) * INVSPAN);
		DWORD stepv = SQWORD((endv - startv) * INVSPAN);
		u = SQWORD(startu) + pviewx;
		v = SQWORD(startv) + pviewy;

		for (i = SPANSIZE-1; i >= 0; i--)
		{
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
			x1++;
			u += stepu;
			v += stepv;
		}
		startu = endu;
		startv = endv;
		width -= SPANSIZE;
	}
	if (width > 0)
	{
		if (width == 1)
		{
			u = SQWORD(startu);
			v = SQWORD(startv);
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
		}
		else
		{
			double left = width;
			iz += plane_sz[0] * left;
			uz += plane_su[0] * left;
			vz += plane_sv[0] * left;

			double endz = 1.f/iz;
			double endu = uz*endz;
			double endv = vz*endz;
			left = 1.f/left;
			DWORD stepu = SQWORD((endu - startu) * left);
			DWORD stepv = SQWORD((endv - startv) * left);
			u = SQWORD(startu) + pviewx;
			v = SQWORD(startv) + pviewy;

			for (; width != 0; width--)
			{
				fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
		}
	}
#endif
}